

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O0

void __thiscall
afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
enqueue_event<vending::events::load_goods>
          (state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
           *this,load_goods *event)

{
  id_type *local_50;
  anon_class_24_2_480399db local_48;
  size_t local_30;
  load_goods evt;
  lock_guard lock;
  load_goods *event_local;
  state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
  *this_local;
  
  detail::no_lock::no_lock((no_lock *)&evt.field_0xf,(none *)&this->field_0x138);
  std::__atomic_base<unsigned_long>::operator++
            (&(this->queue_size_).super___atomic_base<unsigned_long>);
  detail::null_observer::
  enqueue_event<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>,vending::events::load_goods>
            ((null_observer *)this,this,event);
  local_48.evt.p_no = event->p_no;
  local_48.evt._8_8_ = *(undefined8 *)&event->amount;
  local_50 = (id_type *)&detail::event<vending::events::load_goods>::id;
  local_48.this = this;
  local_30 = local_48.evt.p_no;
  evt.p_no = local_48.evt._8_8_;
  std::
  deque<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
  ::
  emplace_back<afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>::enqueue_event<vending::events::load_goods>(vending::events::load_goods&&)::_lambda()_1_,afsm::detail::event_base::id_type_const*>
            ((deque<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,afsm::detail::event_base::id_type_const*>>>
              *)&this->queued_events_,&local_48,&local_50);
  process_event_queue(this);
  return;
}

Assistant:

void
    enqueue_event(Event&& event)
    {
        using evt_identity = typename detail::event_identity<Event>::type;
        {
            lock_guard lock{mutex_};
            ++queue_size_;
            observer_wrapper::enqueue_event(*this, ::std::forward<Event>(event));
            Event evt{::std::forward<Event>(event)};
            queued_events_.emplace_back([&, evt]() mutable {
                return process_event_dispatch(::std::move(evt));
            }, &evt_identity::id);
        }
        // Process enqueued events in case we've been waiting for queue
        // mutex release
        process_event_queue();
    }